

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_active_attrib(NegativeTestContext *ctx)

{
  ostringstream *this;
  RenderContext *renderCtx;
  GLuint program_00;
  allocator<char> local_305;
  GLint size;
  GLsizei length;
  GLenum type;
  GLint numActiveAttributes;
  GLchar name [32];
  string local_2b0;
  string local_290;
  undefined1 local_270 [384];
  ShaderProgram program;
  
  program_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  renderCtx = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,
             "${GLSL_VERSION_DECL}\nuniform mediump vec4 vUnif_vec4;\nin mediump vec4 attr;layout(shared) uniform Block { mediump vec4 blockVar; };\nvoid main (void)\n{\n\tgl_Position = vUnif_vec4 + blockVar + attr;\n}\n"
             ,(allocator<char> *)&length);
  getVtxFragVersionSources((string *)name,&local_290,ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,
             "${GLSL_VERSION_DECL}\nuniform mediump ivec4 fUnif_ivec4;\nuniform mediump uvec4 fUnif_uvec4;\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(vec4(fUnif_ivec4) + vec4(fUnif_uvec4));\n}\n"
             ,(allocator<char> *)&size);
  getVtxFragVersionSources((string *)&numActiveAttributes,&local_2b0,ctx);
  glu::makeVtxFragSources((ProgramSources *)local_270,(string *)name,(string *)&numActiveAttributes)
  ;
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_270);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_270);
  std::__cxx11::string::~string((string *)&numActiveAttributes);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)name);
  std::__cxx11::string::~string((string *)&local_290);
  numActiveAttributes = -1;
  length = -1;
  size = -1;
  type = 0xffffffff;
  name[0x10] = '\0';
  name[0x11] = '\0';
  name[0x12] = '\0';
  name[0x13] = '\0';
  name[0x14] = '\0';
  name[0x15] = '\0';
  name[0x16] = '\0';
  name[0x17] = '\0';
  name[0x18] = '\0';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  name[0x1c] = '\0';
  name[0x1d] = '\0';
  name[0x1e] = '\0';
  name[0x1f] = '\0';
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0x8b89,&numActiveAttributes);
  local_270._0_8_ = (ctx->super_CallLogWrapper).m_log;
  this = (ostringstream *)(local_270 + 8);
  std::__cxx11::ostringstream::ostringstream(this);
  std::operator<<((ostream *)this,"// GL_ACTIVE_ATTRIBUTES = ");
  std::ostream::operator<<(this,numActiveAttributes);
  std::operator<<((ostream *)this," (expected 1).");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_270,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,
             "GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.",
             &local_305);
  NegativeTestContext::beginSection(ctx,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  glu::CallLogWrapper::glGetActiveAttrib
            (&ctx->super_CallLogWrapper,0xffffffff,0,0x20,&length,&size,&type,name);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,
             "GL_INVALID_OPERATION is generated if program is not a program object.",&local_305);
  NegativeTestContext::beginSection(ctx,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  glu::CallLogWrapper::glGetActiveAttrib
            (&ctx->super_CallLogWrapper,program_00,0,0x20,&length,&size,&type,name);
  NegativeTestContext::expectError(ctx,0x502);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_ACTIVE_ATTRIBUTES."
             ,&local_305);
  NegativeTestContext::beginSection(ctx,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  glu::CallLogWrapper::glGetActiveAttrib
            (&ctx->super_CallLogWrapper,program.m_program.m_program,numActiveAttributes,0x20,&length
             ,&size,&type,name);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,"GL_INVALID_VALUE is generated if bufSize is less than 0.",
             &local_305);
  NegativeTestContext::beginSection(ctx,(string *)local_270);
  std::__cxx11::string::~string((string *)local_270);
  glu::CallLogWrapper::glGetActiveAttrib
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0,-1,&length,&size,&type,name);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glUseProgram(&ctx->super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,program_00);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void get_active_attrib (NegativeTestContext& ctx)
{
	GLuint				shader				= ctx.glCreateShader(GL_VERTEX_SHADER);
	glu::ShaderProgram	program				(ctx.getRenderContext(), glu::makeVtxFragSources(getVtxFragVersionSources(uniformTestVertSource, ctx), getVtxFragVersionSources(uniformTestFragSource, ctx)));
	GLint				numActiveAttributes	= -1;
	GLsizei				length				= -1;
	GLint				size				= -1;
	GLenum				type				= -1;
	GLchar				name[32];

	deMemset(&name[0], 0, sizeof(name));

	ctx.glGetProgramiv	(program.getProgram(), GL_ACTIVE_ATTRIBUTES,	&numActiveAttributes);
	ctx.getLog() << TestLog::Message << "// GL_ACTIVE_ATTRIBUTES = " << numActiveAttributes << " (expected 1)." << TestLog::EndMessage;

	ctx.glUseProgram(program.getProgram());

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not a value generated by OpenGL.");
	ctx.glGetActiveAttrib(-1, 0, 32, &length, &size, &type, &name[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if program is not a program object.");
	ctx.glGetActiveAttrib(shader, 0, 32, &length, &size, &type, &name[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_ACTIVE_ATTRIBUTES.");
	ctx.glGetActiveAttrib(program.getProgram(), numActiveAttributes, (int)sizeof(name), &length, &size, &type, &name[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if bufSize is less than 0.");
	ctx.glGetActiveAttrib(program.getProgram(), 0, -1, &length, &size, &type, &name[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glUseProgram(0);
	ctx.glDeleteShader(shader);
}